

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O1

void __thiscall TreeWalker::acceptButtonGroups(TreeWalker *this,DomButtonGroups *domButtonGroups)

{
  QArrayData *pQVar1;
  DomButtonGroup **ppDVar2;
  long lVar3;
  long lVar4;
  
  pQVar1 = &((domButtonGroups->m_buttonGroup).d.d)->super_QArrayData;
  ppDVar2 = (domButtonGroups->m_buttonGroup).d.ptr;
  lVar3 = (domButtonGroups->m_buttonGroup).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar3 != 0) {
    lVar4 = 0;
    do {
      (*this->_vptr_TreeWalker[0x22])(this,*(undefined8 *)((long)ppDVar2 + lVar4));
      lVar4 = lVar4 + 8;
    } while (lVar3 << 3 != lVar4);
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

void TreeWalker::acceptButtonGroups(const DomButtonGroups *domButtonGroups)
{
    const auto &domGroups = domButtonGroups->elementButtonGroup();
    for (const DomButtonGroup *g : domGroups)
        acceptButtonGroup(g);
}